

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

optional<const_google::protobuf::Message_*> __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::FindInTypeMap
          (GeneratedMessageFactory *this,Descriptor *type)

{
  bool bVar1;
  pointer prVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<const_google::protobuf::Message_*> oVar4;
  Message *local_58 [2];
  iterator local_48;
  undefined1 local_38 [8];
  iterator it;
  Descriptor *type_local;
  GeneratedMessageFactory *this_local;
  bool local_10;
  
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)type;
  _local_38 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
              ::find<google::protobuf::Descriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                          *)&this->type_map_,
                         (key_arg<const_google::protobuf::Descriptor_*> *)&it.field_1.slot_);
  local_48 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                    *)&this->type_map_);
  bVar1 = absl::lts_20250127::container_internal::operator==((iterator *)local_38,&local_48);
  if (bVar1) {
    std::optional<const_google::protobuf::Message_*>::optional
              ((optional<const_google::protobuf::Message_*> *)&this_local);
    uVar3 = extraout_RDX;
  }
  else {
    prVar2 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
             ::iterator::operator->((iterator *)local_38);
    local_58[0] = MessagePtr::get(&prVar2->second);
    std::optional<const_google::protobuf::Message_*>::
    optional<const_google::protobuf::Message_*,_true>
              ((optional<const_google::protobuf::Message_*> *)&this_local,local_58);
    uVar3 = extraout_RDX_00;
  }
  oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::Message_*>._9_7_ =
       (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::Message_*>._M_engaged = local_10;
  oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload._M_value =
       (Message *)this_local;
  return (optional<const_google::protobuf::Message_*>)
         oVar4.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
         super__Optional_payload_base<const_google::protobuf::Message_*>;
}

Assistant:

ABSL_SHARED_LOCKS_REQUIRED(mutex_)
  {
    auto it = type_map_.find(type);
    if (it == type_map_.end()) return absl::nullopt;
    return it->second.get();
  }